

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

json_t * parse_json(lex_t *lex,size_t flags,json_error_t *error)

{
  json_t *result;
  json_error_t *error_local;
  size_t flags_local;
  lex_t *lex_local;
  
  lex->depth = 0;
  lex_scan(lex,error);
  if ((((flags & 4) == 0) && (lex->token != 0x5b)) && (lex->token != 0x7b)) {
    error_set(error,lex,"\'[\' or \'{\' expected");
    lex_local = (lex_t *)0x0;
  }
  else {
    lex_local = (lex_t *)parse_value(lex,flags,error);
    if (lex_local == (lex_t *)0x0) {
      lex_local = (lex_t *)0x0;
    }
    else if (((flags & 2) == 0) && (lex_scan(lex,error), lex->token != 0)) {
      error_set(error,lex,"end of file expected");
      json_decref((json_t *)lex_local);
      lex_local = (lex_t *)0x0;
    }
    else if (error != (json_error_t *)0x0) {
      error->position = (int)(lex->stream).position;
    }
  }
  return (json_t *)lex_local;
}

Assistant:

static json_t *parse_json(lex_t *lex, size_t flags, json_error_t *error)
{
	json_t *result;

	lex->depth = 0;

	lex_scan(lex, error);
	if (!(flags & JSON_DECODE_ANY)) {
		if (lex->token != '[' && lex->token != '{') {
			error_set(error, lex, "'[' or '{' expected");
			return NULL;
		}
	}

	result = parse_value(lex, flags, error);
	if (!result)
		return NULL;

	if (!(flags & JSON_DISABLE_EOF_CHECK)) {
		lex_scan(lex, error);
		if (lex->token != TOKEN_EOF) {
			error_set(error, lex, "end of file expected");
			json_decref(result);
			return NULL;
		}
	}

	if (error) {
		/* Save the position even though there was no error */
		error->position = (int)lex->stream.position;
	}

	return result;
}